

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::web_peer_connection::handle_error(web_peer_connection *this,int bytes_left)

{
  int ev;
  element_type *this_00;
  optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> retry;
  alert_manager *paVar1;
  error_category *cat;
  string_view key;
  shared_ptr<libtorrent::aux::torrent> t;
  undefined1 local_78 [32];
  string error_msg;
  array<char,_22UL> local_36;
  
  ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&error_msg,
             &(this->super_web_connection_base).super_peer_connection.
              super_peer_connection_hot_members.m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,&error_msg)
  ;
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&error_msg._M_string_length);
  this_00 = t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  key._M_str = "retry-after";
  key._M_len = 0xb;
  retry = http_parser::header_duration(&(this->super_web_connection_base).m_parser,key);
  torrent::retry_web_seed(this_00,(peer_connection *)this,retry);
  paVar1 = torrent::alerts(t.
                           super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
  if (((paVar1->m_alert_mask)._M_i.m_val & 3) != 0) {
    to_string(&local_36,(long)(this->super_web_connection_base).m_parser.m_status_code);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     " ",&(this->super_web_connection_base).m_parser.m_server_message);
    ::std::operator+(&error_msg,local_36._M_elems,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    ::std::__cxx11::string::~string((string *)local_78);
    paVar1 = torrent::alerts(t.
                             super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
    torrent::get_handle((torrent *)local_78);
    alert_manager::
    emplace_alert<libtorrent::url_seed_alert,libtorrent::torrent_handle,std::__cxx11::string&,std::__cxx11::string_const&>
              (paVar1,(torrent_handle *)local_78,&this->m_url,&error_msg);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    ::std::__cxx11::string::~string((string *)&error_msg);
  }
  peer_connection::received_bytes((peer_connection *)this,0,bytes_left);
  ev = (this->super_web_connection_base).m_parser.m_status_code;
  cat = http_category();
  error_msg._M_dataplus._M_p._0_4_ = ev;
  error_msg._M_dataplus._M_p._4_1_ = boost::system::detail::failed_impl(ev,cat);
  error_msg._M_string_length = (size_type)cat;
  (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
    _vptr_bandwidth_socket[0x14])(this,&error_msg,1);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void web_peer_connection::handle_error(int const bytes_left)
{
	auto t = associated_torrent().lock();
	TORRENT_ASSERT(t);

	// TODO: 2 just make this peer not have the pieces
	// associated with the file we just requested. Only
	// when it doesn't have any of the file do the following
	// pad files will make it complicated

	// temporarily unavailable, retry later
	t->retry_web_seed(this, m_parser.header_duration("retry-after"));
	if (t->alerts().should_post<url_seed_alert>())
	{
		std::string const error_msg = to_string(m_parser.status_code()).data()
			+ (" " + m_parser.message());
		t->alerts().emplace_alert<url_seed_alert>(t->get_handle(), m_url
			, error_msg);
	}
	received_bytes(0, bytes_left);
	disconnect(error_code(m_parser.status_code(), http_category()), operation_t::bittorrent, failure);
}